

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testProcrustes.cpp
# Opt level: O0

double procrustesError<float>(Vec3<float> *from,Vec3<float> *to,float *weights,size_t n,M44d *xform)

{
  float fVar1;
  ulong in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  double dVar2;
  double t;
  double y;
  double mag;
  double w;
  Vec3<double> *in_stack_00000028;
  V3d diff;
  V3d xformed;
  size_t i;
  double residual;
  double result;
  Vec3<double> *in_stack_ffffffffffffff40;
  Vec3<double> *in_stack_ffffffffffffff48;
  Vec3<double> local_a0 [2];
  Vec3<double> local_70 [2];
  ulong local_40;
  double local_38;
  Vec3<double> *local_30;
  ulong local_20;
  long local_18;
  long local_10;
  long local_8;
  
  local_30 = (Vec3<double> *)0x0;
  local_38 = 0.0;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  for (local_40 = 0; local_40 < local_20; local_40 = local_40 + 1) {
    Imath_2_5::Vec3<double>::Vec3<float>(local_70,(Vec3<float> *)(local_8 + local_40 * 0xc));
    Imath_2_5::operator*(in_stack_00000028,(Matrix44<double> *)w);
    Imath_2_5::Vec3<double>::Vec3<float>(local_a0,(Vec3<float> *)(local_10 + local_40 * 0xc));
    Imath_2_5::Vec3<double>::operator-(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
    fVar1 = *(float *)(local_18 + local_40 * 4);
    dVar2 = Imath_2_5::Vec3<double>::length2((Vec3<double> *)0x17b044);
    in_stack_ffffffffffffff48 = (Vec3<double> *)((double)fVar1 * dVar2 - local_38);
    in_stack_ffffffffffffff40 =
         (Vec3<double> *)((double)local_30 + (double)in_stack_ffffffffffffff48);
    local_38 = ((double)in_stack_ffffffffffffff40 - (double)local_30) -
               (double)in_stack_ffffffffffffff48;
    local_30 = in_stack_ffffffffffffff40;
  }
  return (double)local_30;
}

Assistant:

double
procrustesError (const IMATH_INTERNAL_NAMESPACE::Vec3<T>* from,
                 const IMATH_INTERNAL_NAMESPACE::Vec3<T>* to,
                 const T* weights,
                 const size_t n,
                 const IMATH_INTERNAL_NAMESPACE::M44d& xform)
{
    double result = 0.0;
    double residual = 0.0;
    for (size_t i = 0; i < n; ++i)
    {
        IMATH_INTERNAL_NAMESPACE::V3d xformed = IMATH_INTERNAL_NAMESPACE::V3d(from[i]) * xform;
        IMATH_INTERNAL_NAMESPACE::V3d diff = xformed - IMATH_INTERNAL_NAMESPACE::V3d(to[i]);
        const double w = weights[i];
        const double mag = w * diff.length2();

        // Use Kahan summation for the heck of it:
        const double y = mag - residual;
        const double t = result + y;
        residual = (t - result) - y;
        result = t;
    }
    return result;
}